

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorLinearDriveline::IntStateGatherReactions
          (ChLinkMotorLinearDriveline *this,uint off_L,ChVectorDynamic<> *L)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  
  ChLinkMateGeneric::IntStateGatherReactions((ChLinkMateGeneric *)this,off_L,L);
  iVar1 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr;
  peVar2 = (this->innerconstraint1lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1f])(peVar2,(ulong)(iVar1 + off_L),L);
  peVar2 = (this->innerconstraint2lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1f])
            (peVar2,(ulong)(iVar1 + 1 + off_L),L);
  peVar3 = (this->innerconstraint2rot).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar3->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1f])
            (peVar3,(ulong)(iVar1 + 2 + off_L),L);
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::IntStateGatherReactions(const unsigned int off_L, ChVectorDynamic<>& L) {
    // First, inherit to parent class
    ChLinkMotorLinear::IntStateGatherReactions(off_L, L);

    int nc = mask.nconstr;
    innerconstraint1lin->IntStateGatherReactions(off_L + nc + 0, L);
    innerconstraint2lin->IntStateGatherReactions(off_L + nc + 1, L);
    innerconstraint2rot->IntStateGatherReactions(off_L + nc + 2, L);
}